

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

void ma_spatializer_get_relative_position_and_direction
               (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
               ma_vec3f *pRelativePos,ma_vec3f *pRelativeDir)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  if (pRelativePos != (ma_vec3f *)0x0) {
    pRelativePos->x = 0.0;
    pRelativePos->y = 0.0;
    pRelativePos->z = 0.0;
  }
  if (pRelativeDir != (ma_vec3f *)0x0) {
    pRelativeDir->x = 0.0;
    pRelativeDir->y = 0.0;
    pRelativeDir->z = -1.0;
  }
  if (pSpatializer != (ma_spatializer *)0x0) {
    if ((pListener == (ma_spatializer_listener *)0x0) ||
       (pSpatializer->positioning == ma_positioning_relative)) {
      if (pRelativePos != (ma_vec3f *)0x0) {
        pRelativePos->z = (pSpatializer->position).z;
        fVar9 = (pSpatializer->position).y;
        pRelativePos->x = (pSpatializer->position).x;
        pRelativePos->y = fVar9;
      }
      if (pRelativeDir != (ma_vec3f *)0x0) {
        pRelativeDir->z = (pSpatializer->direction).z;
        fVar9 = (pSpatializer->direction).y;
        pRelativeDir->x = (pSpatializer->direction).x;
        pRelativeDir->y = fVar9;
      }
    }
    else {
      uVar2 = (pListener->direction).x;
      uVar5 = (pListener->direction).y;
      fVar9 = (pListener->direction).z;
      fVar8 = fVar9 * fVar9 + (float)uVar2 * (float)uVar2 + (float)uVar5 * (float)uVar5;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar11 = 0.0;
      fVar17 = 0.0;
      fVar18 = 0.0;
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        fVar8 = 1.0 / fVar8;
        fVar17 = (float)uVar2 * fVar8;
        fVar18 = (float)uVar5 * fVar8;
        fVar11 = fVar9 * fVar8;
      }
      uVar3 = (pListener->config).worldUp.x;
      uVar6 = (pListener->config).worldUp.y;
      fVar9 = (pListener->config).worldUp.z;
      fVar13 = fVar18 * fVar9 - fVar11 * (float)uVar6;
      fVar8 = fVar11 * (float)uVar3 - fVar9 * fVar17;
      fVar12 = (float)uVar6 * fVar17 - (float)uVar3 * fVar18;
      fVar9 = fVar12 * fVar12 + fVar13 * fVar13 + fVar8 * fVar8;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      fVar19 = 0.0;
      fVar15 = 0.0;
      fVar16 = 0.0;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        fVar9 = 1.0 / fVar9;
        fVar15 = fVar13 * fVar9;
        fVar16 = fVar8 * fVar9;
        fVar19 = fVar9 * fVar12;
      }
      fVar9 = fVar19 * fVar19 + fVar15 * fVar15 + fVar16 * fVar16;
      if ((fVar9 == 0.0) && (!NAN(fVar9))) {
        fVar15 = 1.0;
        fVar16 = 0.0;
      }
      fVar8 = -fVar18;
      if ((fVar9 == 0.0) && (!NAN(fVar9))) {
        fVar19 = 0.0;
      }
      fVar10 = -fVar17;
      fVar9 = fVar19;
      fVar12 = fVar15;
      fVar13 = fVar16;
      if ((pListener->config).handedness == ma_handedness_left) {
        fVar9 = -fVar19;
        fVar12 = -fVar15;
        fVar13 = -fVar16;
      }
      fVar14 = fVar16 * fVar11 + fVar19 * fVar8;
      fVar19 = fVar19 * fVar17 - fVar11 * fVar15;
      fVar17 = fVar18 * fVar15 - fVar16 * fVar17;
      fVar11 = -fVar11;
      if (pRelativePos != (ma_vec3f *)0x0) {
        fVar18 = (pListener->position).z;
        uVar4 = (pListener->position).x;
        uVar7 = (pListener->position).y;
        fVar16 = (pSpatializer->position).x;
        fVar15 = (pSpatializer->position).y;
        fVar1 = (pSpatializer->position).z;
        pRelativePos->x =
             (fVar9 * fVar1 + fVar12 * fVar16 + fVar13 * fVar15) -
             (fVar18 * fVar9 + (float)uVar4 * fVar12 + (float)uVar7 * fVar13);
        pRelativePos->y =
             (fVar17 * fVar1 + fVar14 * fVar16 + fVar19 * fVar15) -
             (fVar17 * fVar18 + fVar14 * (float)uVar4 + fVar19 * (float)uVar7);
        pRelativePos->z =
             (fVar1 * fVar11 + fVar16 * fVar10 + fVar15 * fVar8) -
             (fVar11 * fVar18 + fVar10 * (float)uVar4 + (float)uVar7 * fVar8);
      }
      if (pRelativeDir != (ma_vec3f *)0x0) {
        fVar18 = (pSpatializer->direction).x;
        fVar16 = (pSpatializer->direction).y;
        fVar15 = (pSpatializer->direction).z;
        pRelativeDir->x = fVar9 * fVar15 + fVar12 * fVar18 + fVar13 * fVar16;
        pRelativeDir->y = fVar17 * fVar15 + fVar14 * fVar18 + fVar19 * fVar16;
        pRelativeDir->z = fVar11 * fVar15 + fVar10 * fVar18 + fVar8 * fVar16;
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_spatializer_get_relative_position_and_direction(const ma_spatializer* pSpatializer, const ma_spatializer_listener* pListener, ma_vec3f* pRelativePos, ma_vec3f* pRelativeDir)
{
    if (pRelativePos != NULL) {
        pRelativePos->x = 0;
        pRelativePos->y = 0;
        pRelativePos->z = 0;
    }

    if (pRelativeDir != NULL) {
        pRelativeDir->x = 0;
        pRelativeDir->y = 0;
        pRelativeDir->z = -1;
    }

    if (pSpatializer == NULL) {
        return;
    }

    if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
        /* There's no listener or we're using relative positioning. */
        if (pRelativePos != NULL) {
            *pRelativePos = pSpatializer->position;
        }
        if (pRelativeDir != NULL) {
            *pRelativeDir = pSpatializer->direction;
        }
    } else {
        ma_vec3f v;
        ma_vec3f axisX;
        ma_vec3f axisY;
        ma_vec3f axisZ;
        float m[4][4];

        /*
        We need to calcualte the right vector from our forward and up vectors. This is done with
        a cross product.
        */
        axisZ = ma_vec3f_normalize(pListener->direction);                               /* Normalization required here because we can't trust the caller. */
        axisX = ma_vec3f_normalize(ma_vec3f_cross(axisZ, pListener->config.worldUp));   /* Normalization required here because the world up vector may not be perpendicular with the forward vector. */

        /*
        The calculation of axisX above can result in a zero-length vector if the listener is
        looking straight up on the Y axis. We'll need to fall back to a +X in this case so that
        the calculations below don't fall apart. This is where a quaternion based listener and
        sound orientation would come in handy.
        */
        if (ma_vec3f_len2(axisX) == 0) {
            axisX = ma_vec3f_init_3f(1, 0, 0);
        }

        axisY = ma_vec3f_cross(axisX, axisZ);                                           /* No normalization is required here because axisX and axisZ are unit length and perpendicular. */

        /*
        We need to swap the X axis if we're left handed because otherwise the cross product above
        will have resulted in it pointing in the wrong direction (right handed was assumed in the
        cross products above).
        */
        if (pListener->config.handedness == ma_handedness_left) {
            axisX = ma_vec3f_neg(axisX);
        }

        /* Lookat. */
        m[0][0] =  axisX.x; m[1][0] =  axisX.y; m[2][0] =  axisX.z; m[3][0] = -ma_vec3f_dot(axisX,               pListener->position);
        m[0][1] =  axisY.x; m[1][1] =  axisY.y; m[2][1] =  axisY.z; m[3][1] = -ma_vec3f_dot(axisY,               pListener->position);
        m[0][2] = -axisZ.x; m[1][2] = -axisZ.y; m[2][2] = -axisZ.z; m[3][2] = -ma_vec3f_dot(ma_vec3f_neg(axisZ), pListener->position);
        m[0][3] = 0;        m[1][3] = 0;        m[2][3] = 0;        m[3][3] = 1;

        /*
        Multiply the lookat matrix by the spatializer position to transform it to listener
        space. This allows calculations to work based on the sound being relative to the
        origin which makes things simpler.
        */
        if (pRelativePos != NULL) {
            v = pSpatializer->position;
            pRelativePos->x = m[0][0] * v.x + m[1][0] * v.y + m[2][0] * v.z + m[3][0] * 1;
            pRelativePos->y = m[0][1] * v.x + m[1][1] * v.y + m[2][1] * v.z + m[3][1] * 1;
            pRelativePos->z = m[0][2] * v.x + m[1][2] * v.y + m[2][2] * v.z + m[3][2] * 1;
        }

        /*
        The direction of the sound needs to also be transformed so that it's relative to the
        rotation of the listener.
        */
        if (pRelativeDir != NULL) {
            v = pSpatializer->direction;
            pRelativeDir->x = m[0][0] * v.x + m[1][0] * v.y + m[2][0] * v.z;
            pRelativeDir->y = m[0][1] * v.x + m[1][1] * v.y + m[2][1] * v.z;
            pRelativeDir->z = m[0][2] * v.x + m[1][2] * v.y + m[2][2] * v.z;
        }
    }
}